

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O0

int Parser_skipComment(char **pstrSrc)

{
  char *pcVar1;
  size_t sVar2;
  char *pStrFound;
  char **pstrSrc_local;
  
  if (*pstrSrc != (char *)0x0) {
    if (*pstrSrc == (char *)0x0) {
      pstrSrc_local._4_4_ = 0x6a;
    }
    else {
      pcVar1 = strstr(*pstrSrc,END_COMMENT);
      if (((pcVar1 == (char *)0x0) || (pcVar1 == *pstrSrc)) || (pcVar1[-1] == '-')) {
        pstrSrc_local._4_4_ = 0xc;
      }
      else {
        sVar2 = strlen(END_COMMENT);
        *pstrSrc = pcVar1 + sVar2;
        pstrSrc_local._4_4_ = 0;
      }
    }
    return pstrSrc_local._4_4_;
  }
  __assert_fail("(*pstrSrc) != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/ixmlparser.c"
                ,0x28c,"int Parser_skipComment(char **)");
}

Assistant:

static int Parser_skipComment(
	/*! [in,out] The pointer to the skipped point. */
	char **pstrSrc)
{
	char *pStrFound = NULL;

	assert((*pstrSrc) != NULL);
	if (*pstrSrc == NULL) {
		return IXML_FAILED;
	}

	pStrFound = strstr(*pstrSrc, END_COMMENT);
	if ((pStrFound != NULL) && (pStrFound != *pstrSrc) &&
		(*(pStrFound - 1) != '-')) {
		*pstrSrc = pStrFound + strlen(END_COMMENT);
	} else {
		return IXML_SYNTAX_ERR;
	}

	return IXML_SUCCESS;
}